

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tpzdohrsubstruct.cpp
# Opt level: O2

void __thiscall
TPZDohrSubstruct<std::complex<float>_>::Contribute_v3
          (TPZDohrSubstruct<std::complex<float>_> *this,TPZFMatrix<std::complex<float>_> *v3,
          TPZFMatrix<std::complex<float>_> *r,TPZFMatrix<std::complex<float>_> *v1Plusv2)

{
  _ComplexT _Var1;
  _ComplexT _Var2;
  uint uVar3;
  int iVar4;
  pair<int,_int> *ppVar5;
  TPZMatrix<std::complex<float>_> *pTVar6;
  complex<float> *pcVar7;
  complex<float> *pcVar8;
  ulong uVar9;
  ulong uVar10;
  long lVar11;
  undefined4 extraout_XMM0_Da;
  undefined4 extraout_XMM0_Db;
  float local_f48;
  float fStack_f44;
  float local_f28;
  float fStack_f24;
  complex<float> local_f18;
  TPZFNMatrix<100,_std::complex<float>_> vec_t;
  TPZFNMatrix<100,_std::complex<float>_> inv_sys;
  TPZFNMatrix<100,_std::complex<float>_> vec_t3;
  TPZFNMatrix<100,_std::complex<float>_> vec_t2;
  
  vec_t2.super_TPZFMatrix<std::complex<float>_>.super_TPZMatrix<std::complex<float>_>.
  super_TPZBaseMatrix.super_TPZSavable._vptr_TPZSavable = (_func_int **)0x0;
  TPZFNMatrix<100,_std::complex<float>_>::TPZFNMatrix
            (&vec_t,(long)this->fNEquations,1,(complex<float> *)&vec_t2);
  vec_t3.super_TPZFMatrix<std::complex<float>_>.super_TPZMatrix<std::complex<float>_>.
  super_TPZBaseMatrix.super_TPZSavable._vptr_TPZSavable = (_func_int **)0x0;
  TPZFNMatrix<100,_std::complex<float>_>::TPZFNMatrix
            (&vec_t2,(long)this->fNEquations,1,(complex<float> *)&vec_t3);
  inv_sys.super_TPZFMatrix<std::complex<float>_>.super_TPZMatrix<std::complex<float>_>.
  super_TPZBaseMatrix.super_TPZSavable._vptr_TPZSavable = (_func_int **)0x0;
  TPZFNMatrix<100,_std::complex<float>_>::TPZFNMatrix
            (&vec_t3,(this->fInternalEqs).fNElements,1,(complex<float> *)&inv_sys);
  local_f18._M_value = 0;
  TPZFNMatrix<100,_std::complex<float>_>::TPZFNMatrix
            (&inv_sys,(this->fInternalEqs).fNElements,1,&local_f18);
  uVar3 = (uint)(this->fGlobalEqs).fNElements;
  uVar10 = 0;
  uVar9 = (ulong)uVar3;
  if ((int)uVar3 < 1) {
    uVar9 = uVar10;
  }
  for (; uVar9 != uVar10; uVar10 = uVar10 + 1) {
    ppVar5 = (this->fGlobalEqs).fStore;
    iVar4 = ppVar5[uVar10].first;
    pcVar7 = TPZFMatrix<std::complex<float>_>::operator()(v1Plusv2,(long)ppVar5[uVar10].second,0);
    pcVar8 = TPZFMatrix<std::complex<float>_>::operator()
                       (&vec_t.super_TPZFMatrix<std::complex<float>_>,(long)iVar4,0);
    pcVar8->_M_value = pcVar7->_M_value;
  }
  pTVar6 = ((this->fStiffness).fRef)->fPointer;
  (*(pTVar6->super_TPZBaseMatrix).super_TPZSavable._vptr_TPZSavable[0x25])(pTVar6,&vec_t,&vec_t2);
  for (uVar10 = 0; uVar9 != uVar10; uVar10 = uVar10 + 1) {
    ppVar5 = (this->fGlobalEqs).fStore;
    iVar4 = ppVar5[uVar10].first;
    (*(r->super_TPZMatrix<std::complex<float>_>).super_TPZBaseMatrix.super_TPZSavable.
      _vptr_TPZSavable[0x24])(r,(long)ppVar5[uVar10].second,0);
    pcVar7 = TPZFMatrix<std::complex<float>_>::operator()
                       (&vec_t.super_TPZFMatrix<std::complex<float>_>,(long)iVar4,0);
    *(undefined4 *)&pcVar7->_M_value = extraout_XMM0_Da;
    *(undefined4 *)((long)&pcVar7->_M_value + 4) = extraout_XMM0_Db;
  }
  for (lVar11 = 0; lVar11 < (this->fInternalEqs).fNElements; lVar11 = lVar11 + 1) {
    pcVar7 = TPZFMatrix<std::complex<float>_>::operator()
                       (&vec_t.super_TPZFMatrix<std::complex<float>_>,
                        (long)(this->fInternalEqs).fStore[lVar11],0);
    pcVar8 = TPZFMatrix<std::complex<float>_>::operator()
                       (&vec_t2.super_TPZFMatrix<std::complex<float>_>,
                        (long)(this->fInternalEqs).fStore[lVar11],0);
    _Var1 = pcVar7->_M_value;
    _Var2 = pcVar8->_M_value;
    pcVar7 = TPZFMatrix<std::complex<float>_>::operator()
                       (&vec_t3.super_TPZFMatrix<std::complex<float>_>,lVar11,0);
    local_f48 = (float)_Var1;
    fStack_f44 = (float)(_Var1 >> 0x20);
    local_f28 = (float)_Var2;
    fStack_f24 = (float)(_Var2 >> 0x20);
    pcVar7->_M_value = CONCAT44(fStack_f44 - fStack_f24,local_f48 - local_f28);
  }
  TPZStepSolver<std::complex<float>_>::Solve
            (&this->fInvertedInternalStiffness,&vec_t3.super_TPZFMatrix<std::complex<float>_>,
             &inv_sys.super_TPZFMatrix<std::complex<float>_>,(TPZFMatrix<std::complex<float>_> *)0x0
            );
  memset(vec_t.super_TPZFMatrix<std::complex<float>_>.fElem,0,
         vec_t.super_TPZFMatrix<std::complex<float>_>.super_TPZMatrix<std::complex<float>_>.
         super_TPZBaseMatrix.fRow *
         vec_t.super_TPZFMatrix<std::complex<float>_>.super_TPZMatrix<std::complex<float>_>.
         super_TPZBaseMatrix.fCol * 8);
  vec_t.super_TPZFMatrix<std::complex<float>_>.super_TPZMatrix<std::complex<float>_>.
  super_TPZBaseMatrix.fDecomposed = '\0';
  for (lVar11 = 0; lVar11 < (this->fInternalEqs).fNElements; lVar11 = lVar11 + 1) {
    pcVar7 = TPZFMatrix<std::complex<float>_>::operator()
                       (&inv_sys.super_TPZFMatrix<std::complex<float>_>,lVar11,0);
    pcVar8 = TPZFMatrix<std::complex<float>_>::operator()
                       (&vec_t.super_TPZFMatrix<std::complex<float>_>,
                        (long)(this->fInternalEqs).fStore[lVar11],0);
    pcVar8->_M_value = pcVar7->_M_value;
  }
  TPZFMatrix<std::complex<float>_>::operator=(v3,&vec_t.super_TPZFMatrix<std::complex<float>_>);
  TPZFNMatrix<100,_std::complex<float>_>::~TPZFNMatrix(&inv_sys);
  TPZFNMatrix<100,_std::complex<float>_>::~TPZFNMatrix(&vec_t3);
  TPZFNMatrix<100,_std::complex<float>_>::~TPZFNMatrix(&vec_t2);
  TPZFNMatrix<100,_std::complex<float>_>::~TPZFNMatrix(&vec_t);
  return;
}

Assistant:

void TPZDohrSubstruct<TVar>::Contribute_v3(TPZFMatrix<TVar> &v3, const TPZFMatrix<TVar> &r, TPZFMatrix<TVar> &v1Plusv2) const {
	TPZFNMatrix<100,TVar> vec_t(fNEquations,1,0.);
	TPZFNMatrix<100,TVar> vec_t2(fNEquations,1,0.);
	TPZFNMatrix<100,TVar> vec_t3(fInternalEqs.NElements(),1,0.);
	TPZFNMatrix<100,TVar> inv_sys(fInternalEqs.NElements(),1,0.);
	int i;
	int neqs = fGlobalEqs.NElements();
	//vec_t=R(i)(v1+v2)
	for (i=0;i<neqs;i++) {
		std::pair<int,int> ind = fGlobalEqs[i];
		vec_t(ind.first,0) = v1Plusv2(ind.second,0);
	}
	//vec_t2=K(i)*vec_t
	fStiffness->Multiply(vec_t, vec_t2, 0);
	//vec_t=R(i)r
	for (i=0;i<neqs;i++) {
		std::pair<int,int> ind = fGlobalEqs[i];
		vec_t(ind.first,0) = r.GetVal(ind.second,0);
	}
	//vec_t3=R(Ii)*(vec_t - vec_t2)
	for (i=0;i<fInternalEqs.NElements();i++) {
		vec_t3(i,0) = vec_t(fInternalEqs[i],0) - vec_t2(fInternalEqs[i],0);
	}
	//inv_sys = temp_inverted * vec_t3
	fInvertedInternalStiffness.Solve(vec_t3, inv_sys);
	//vec_t=R(Ii)_transposed * inv_sys
	vec_t.Zero();
	for (i=0;i<fInternalEqs.NElements();i++) {
		vec_t(fInternalEqs[i],0) = inv_sys(i,0);
	}
#ifndef MAKEINTERNAL
	//v3=v3+R(i)_transposed*vec_t
	for (i=0;i<neqs;i++) {
		std::pair<int,int> ind = fGlobalEqs[i];
		v3(ind.second,0) += vec_t(ind.first,0);
	}
#else
	v3 = vec_t;
#endif
	
}